

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_inexact_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp_tag_t sVar1;
  long lVar2;
  long lVar3;
  sexp psVar4;
  ulong uVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  sexp local_40;
  double local_38;
  undefined8 uStack_30;
  sexp_gc_var_t local_20;
  
  local_40 = (sexp)0x43e;
  lVar2 = (long)z >> 1;
  if (((ulong)z & 3) == 0) {
    sVar1 = z->tag;
    if (sVar1 == 0xe) {
      psVar4 = sexp_complex_sqrt(ctx,z);
      psVar4 = sexp_complex_normalize(psVar4);
      return psVar4;
    }
    if (sVar1 == 0xd) {
      local_38 = sexp_ratio_to_double(ctx,z);
      in_XMM1_Qb = extraout_XMM0_Qb;
    }
    else {
      if (sVar1 != 0xb) goto LAB_001290ba;
      local_38 = (z->value).flonum;
      in_XMM1_Qb = 0;
    }
  }
  else {
    if (((ulong)z & 1) == 0) {
LAB_001290ba:
      psVar4 = sexp_type_exception(ctx,self,3,z);
      return psVar4;
    }
    local_38 = (double)lVar2;
  }
  dVar6 = -local_38;
  if (-local_38 <= local_38) {
    dVar6 = local_38;
  }
  local_20.var = &local_40;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  uStack_30 = in_XMM1_Qb;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if (((ulong)z & 1) != 0) {
    uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    lVar3 = -lVar2;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    if (uVar5 * uVar5 - lVar3 == 0) {
      dVar6 = round(dVar6);
      psVar4 = (sexp)((long)dVar6 * 2 + 1);
      goto LAB_00129185;
    }
  }
  psVar4 = sexp_make_flonum(ctx,dVar6);
LAB_00129185:
  if (local_38 < 0.0) {
    local_40 = psVar4;
    psVar4 = sexp_make_complex(ctx,(sexp)&DAT_00000001,psVar4);
  }
  (ctx->value).context.saves = local_20.next;
  return psVar4;
}

Assistant:

sexp sexp_inexact_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
#if SEXP_USE_COMPLEX
  int negativep = 0;
#endif
  double d, r;
  sexp_gc_var1(res);
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z); /* may be larger or smaller than z */
  maybe_convert_ratio(ctx, z)         /* TODO: add ratio sqrt */
  maybe_convert_complex(z, sexp_complex_sqrt)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    negativep = 1;
    d = -d;
  }
#endif
  sexp_gc_preserve1(ctx, res);
  r = sqrt(d);
  if (sexp_fixnump(z)
      && (((sexp_uint_t)r*(sexp_uint_t)r)==labs(sexp_unbox_fixnum(z))))
    res = sexp_make_fixnum(round(r));
  else
    res = sexp_make_flonum(ctx, r);
#if SEXP_USE_COMPLEX
  if (negativep)
    res = sexp_make_complex(ctx, SEXP_ZERO, res);
#endif
  sexp_gc_release1(ctx);
  return res;
}